

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rule_utils.cpp
# Opt level: O2

RuleBuilder * __thiscall Potassco::RuleBuilder::startMinimize(RuleBuilder *this,Weight_t prio)

{
  undefined4 in_EAX;
  uint uVar1;
  Rule *pRVar2;
  undefined8 uStack_18;
  Weight_t prio_local;
  
  uStack_18 = CONCAT44(prio,in_EAX);
  pRVar2 = (Rule *)(this->mem_).beg_;
  uVar1 = *(uint *)pRVar2;
  if ((int)uVar1 < 0) {
    pRVar2->head = (Span)0x0;
    pRVar2->body = (Span)0x0;
    *(undefined4 *)pRVar2 = 0x14;
    uVar1 = 0x14;
  }
  else if (((ulong)pRVar2->head & 0x3fffffff) != 0) goto LAB_00115976;
  if (((ulong)pRVar2->body & 0x3fffffff) == 0) {
    (pRVar2->head).mend = uVar1;
    *(uint *)&pRVar2->head = uVar1 & 0x3fffffff | 0x80000000;
    pRVar2 = anon_unknown_21::push<int>(&this->mem_,pRVar2,&prio_local);
    uVar1 = *(uint *)pRVar2;
    (pRVar2->body).mend = uVar1 & 0x7fffffff;
    *(uint *)&pRVar2->body = uVar1 & 0x3fffffff | 0x40000000;
    return this;
  }
LAB_00115976:
  fail(-1,"RuleBuilder &Potassco::RuleBuilder::startMinimize(Weight_t)",0x98,
       "!r->head.mbeg && !r->body.mbeg","Invalid call to startMinimize()",0,uStack_18);
}

Assistant:

RuleBuilder& RuleBuilder::startMinimize(Weight_t prio) {
	Rule* r = unfreeze(true);
	POTASSCO_ASSERT(!r->head.mbeg && !r->body.mbeg, "Invalid call to startMinimize()");
	r->head.init(r->top, Directive_t::Minimize);
	r = push(mem_, r, prio);
	r->body.init(r->top, Body_t::Sum);
	return *this;
}